

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

bool __thiscall slang::ast::Type::isDerivedFrom(Type *this,Type *base)

{
  bool bVar1;
  ClassType *this_00;
  ClassType *this_01;
  
  this_00 = (ClassType *)getCanonicalType(this);
  this_01 = (ClassType *)getCanonicalType(base);
  bVar1 = isClass((Type *)this_01);
  if (bVar1) {
    do {
      if (this_00 == (ClassType *)0x0) goto LAB_00236b92;
      bVar1 = isClass(&this_00->super_Type);
      if (!bVar1) {
        bVar1 = isError(&this_00->super_Type);
        if (bVar1) {
          return true;
        }
        goto LAB_00236b92;
      }
      this_00 = (ClassType *)ClassType::getBaseClass(this_00);
    } while (this_00 != this_01);
    bVar1 = true;
  }
  else {
LAB_00236b92:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Type::isDerivedFrom(const Type& base) const {
    const Type* d = &getCanonicalType();
    const Type* b = &base.getCanonicalType();
    if (!b->isClass())
        return false;

    while (d && d->isClass()) {
        d = d->as<ClassType>().getBaseClass();
        if (d == b)
            return true;
    }

    // Allow error types to be convertible / derivable from anything else,
    // to prevent knock-on errors from being reported.
    if (d && d->isError())
        return true;

    return false;
}